

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

bool __thiscall jpge::jpeg_encoder::process_scanline(jpeg_encoder *this,void *pScanline)

{
  if ((byte)(this->m_pass_num - 3) < 0xfe) {
    return false;
  }
  if (this->m_all_stream_writes_succeeded == true) {
    if (pScanline == (void *)0x0) {
      process_end_of_image(this);
    }
    else {
      load_mcu(this,pScanline);
    }
  }
  return this->m_all_stream_writes_succeeded;
}

Assistant:

bool jpeg_encoder::process_scanline(const void* pScanline)
{
  if ((m_pass_num < 1) || (m_pass_num > 2)) return false;
  if (m_all_stream_writes_succeeded)
  {
    if (!pScanline)
    {
      if (!process_end_of_image()) return false;
    }
    else
    {
      load_mcu(pScanline);
    }
  }
  return m_all_stream_writes_succeeded;
}